

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void * lua_newuserdata(lua_State *L,size_t size)

{
  uint64_t uVar1;
  TValue *pTVar2;
  GCudata *pGVar3;
  ulong uVar4;
  GCRef *pGVar5;
  
  uVar1 = (L->glref).ptr64;
  if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
    lj_gc_step(L);
  }
  if (size < 0x7fffff01) {
    uVar4 = L->base[-2].u64 & 0x7fffffffffff;
    pGVar5 = &L->env;
    if (*(char *)(uVar4 + 9) == '\b') {
      pGVar5 = (GCRef *)(uVar4 + 0x10);
    }
    pGVar3 = lj_udata_new(L,(MSize)size,(GCtab *)pGVar5->gcptr64);
    L->top->u64 = (ulong)pGVar3 | 0xfff9800000000000;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    if ((TValue *)(L->maxstack).ptr64 <= pTVar2 + 1) {
      lj_state_growstack1(L);
    }
    return pGVar3 + 1;
  }
  lj_err_msg(L,LJ_ERR_UDATAOV);
}

Assistant:

LUA_API void *lua_newuserdata(lua_State *L, size_t size)
{
  GCudata *ud;
  lj_gc_check(L);
  if (size > LJ_MAX_UDATA)
    lj_err_msg(L, LJ_ERR_UDATAOV);
  ud = lj_udata_new(L, (MSize)size, getcurrenv(L));
  setudataV(L, L->top, ud);
  incr_top(L);
  return uddata(ud);
}